

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_tableref.cpp
# Opt level: O2

unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>,_true>
duckdb::EmptyTableRef::Deserialize(Deserializer *deserializer)

{
  EmptyTableRef *this;
  
  this = (EmptyTableRef *)operator_new(0x68);
  EmptyTableRef(this);
  deserializer->_vptr_Deserializer = (_func_int **)this;
  return (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)
         (unique_ptr<duckdb::TableRef,_std::default_delete<duckdb::TableRef>_>)deserializer;
}

Assistant:

unique_ptr<TableRef> EmptyTableRef::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<EmptyTableRef>(new EmptyTableRef());
	return std::move(result);
}